

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_microtime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  timeval tv;
  timeval local_38;
  
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  if ((0 < nArg) && (iVar1 = jx9_value_to_bool(*apArg), iVar1 != 0)) {
    jx9_result_double(pCtx,(double)local_38.tv_sec);
    return 0;
  }
  jx9_result_string_format(pCtx,"%ld %ld",local_38.tv_usec,local_38.tv_sec);
  return 0;
}

Assistant:

static int jx9Builtin_microtime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int bFloat = 0;
	sytime sTime;	
#if defined(__UNIXES__)
	struct timeval tv;
	gettimeofday(&tv, 0);
	sTime.tm_sec  = (long)tv.tv_sec;
	sTime.tm_usec = (long)tv.tv_usec;
#else
	time_t tt;
	time(&tt);
	sTime.tm_sec  = (long)tt;
	sTime.tm_usec = (long)(tt%SX_USEC_PER_SEC);
#endif /* __UNIXES__ */
	if( nArg > 0 ){
		bFloat = jx9_value_to_bool(apArg[0]);
	}
	if( bFloat ){
		/* Return as float */
		jx9_result_double(pCtx, (double)sTime.tm_sec);
	}else{
		/* Return as string */
		jx9_result_string_format(pCtx, "%ld %ld", sTime.tm_usec, sTime.tm_sec);
	}
	return JX9_OK;
}